

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterBuilder.cpp
# Opt level: O2

void __thiscall
slang::ast::ParameterBuilder::setAssignments
          (ParameterBuilder *this,ParameterValueAssignmentSyntax *syntax,bool isFromConfig)

{
  group_type_pointer pgVar1;
  char *pcVar2;
  SyntaxKind SVar3;
  Scope *pSVar4;
  long lVar5;
  ulong uVar6;
  pointer pTVar7;
  int iVar8;
  SyntaxKind *pSVar9;
  ConstTokenOrSyntax *pCVar10;
  ParameterBuilder *pPVar11;
  undefined8 uVar12;
  value_type_pointer ppVar13;
  byte bVar14;
  bool bVar15;
  byte bVar16;
  uint uVar17;
  NamedParamAssignmentSyntax *pNVar18;
  SourceLocation SVar19;
  uint64_t uVar20;
  Diagnostic *pDVar21;
  undefined1 uVar22;
  undefined7 in_register_00000011;
  NamedParamAssignmentSyntax *pNVar23;
  SyntaxNode *pSVar24;
  NamedParamAssignmentSyntax *pNVar25;
  ulong uVar26;
  ParameterValueAssignmentSyntax *pPVar27;
  long lVar28;
  ulong uVar29;
  uint64_t uVar30;
  pointer pTVar31;
  basic_string_view<char,_std::char_traits<char>_> *pbVar32;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>
  *ppVar33;
  ParameterValueAssignmentSyntax *pPVar34;
  Token *this_00;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 uVar39;
  undefined1 uVar40;
  uchar uVar41;
  NumericTokenFlags NVar42;
  undefined1 uVar43;
  undefined1 uVar44;
  uchar uVar45;
  uchar uVar46;
  uchar uVar47;
  byte bVar48;
  undefined1 uVar49;
  undefined1 uVar50;
  uchar uVar51;
  undefined1 uVar52;
  undefined1 uVar53;
  uchar uVar54;
  uchar uVar55;
  undefined1 uVar56;
  uchar uVar57;
  byte bVar58;
  undefined1 uVar59;
  undefined1 uVar60;
  undefined1 uVar61;
  uchar uVar62;
  undefined1 uVar63;
  undefined1 uVar64;
  uchar uVar65;
  uchar uVar66;
  undefined1 uVar67;
  uchar uVar68;
  byte bVar69;
  undefined1 uVar70;
  string_view arg;
  iterator __begin3;
  const_iterator __begin2;
  string_view name;
  SmallVector<const_slang::syntax::OrderedParamAssignmentSyntax_*,_5UL> orderedParams;
  SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>,_8UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL,_16UL>_>
  namedParams;
  try_emplace_args_t local_2b9;
  ParameterValueAssignmentSyntax *local_2b8;
  ParameterBuilder *local_2b0;
  NamedParamAssignmentSyntax *local_2a8;
  uint64_t local_2a0;
  ulong local_298;
  NamedParamAssignmentSyntax *local_290;
  int local_284;
  undefined1 local_280 [25];
  undefined1 uStack_267;
  uchar uStack_266;
  NumericTokenFlags NStack_265;
  undefined1 uStack_264;
  undefined1 uStack_263;
  uchar uStack_262;
  byte bStack_261;
  undefined1 uStack_260;
  undefined1 uStack_25f;
  uchar uStack_25e;
  byte bStack_25d;
  undefined1 uStack_25c;
  undefined1 uStack_25b;
  uchar uStack_25a;
  byte bStack_259;
  iterator_base<const_slang::syntax::ParamAssignmentSyntax_*> local_258;
  undefined8 local_248;
  undefined1 uStack_240;
  undefined1 uStack_23f;
  undefined1 uStack_23e;
  undefined1 uStack_23d;
  undefined1 uStack_23c;
  undefined1 uStack_23b;
  undefined1 uStack_23a;
  undefined1 uStack_239;
  undefined8 local_238;
  uchar uStack_230;
  uchar uStack_22f;
  uchar uStack_22e;
  byte bStack_22d;
  uchar uStack_22c;
  uchar uStack_22b;
  uchar uStack_22a;
  byte bStack_229;
  uint64_t local_228;
  pointer local_220;
  string_view local_218;
  pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool> local_208;
  undefined1 local_1f8;
  undefined1 uStack_1f7;
  undefined1 uStack_1f6;
  undefined1 uStack_1f5;
  undefined1 uStack_1f4;
  undefined1 uStack_1f3;
  undefined1 uStack_1f2;
  undefined1 uStack_1f1;
  undefined1 uStack_1f0;
  undefined1 uStack_1ef;
  undefined1 uStack_1ee;
  undefined1 uStack_1ed;
  undefined1 uStack_1ec;
  undefined1 uStack_1eb;
  undefined1 uStack_1ea;
  undefined1 uStack_1e9;
  undefined1 local_1e8;
  undefined1 uStack_1e7;
  undefined1 uStack_1e6;
  undefined1 uStack_1e5;
  undefined1 uStack_1e4;
  undefined1 uStack_1e3;
  undefined1 uStack_1e2;
  undefined1 uStack_1e1;
  undefined1 uStack_1e0;
  undefined1 uStack_1df;
  undefined1 uStack_1de;
  undefined1 uStack_1dd;
  undefined1 uStack_1dc;
  undefined1 uStack_1db;
  undefined1 uStack_1da;
  undefined1 uStack_1d9;
  uchar local_1d8;
  uchar uStack_1d7;
  uchar uStack_1d6;
  byte bStack_1d5;
  uchar uStack_1d4;
  uchar uStack_1d3;
  uchar uStack_1d2;
  byte bStack_1d1;
  uchar uStack_1d0;
  uchar uStack_1cf;
  uchar uStack_1ce;
  byte bStack_1cd;
  uchar uStack_1cc;
  uchar uStack_1cb;
  uchar uStack_1ca;
  byte bStack_1c9;
  undefined1 local_1c8;
  undefined1 uStack_1c7;
  uchar uStack_1c6;
  byte bStack_1c5;
  undefined1 uStack_1c4;
  undefined1 uStack_1c3;
  uchar uStack_1c2;
  byte bStack_1c1;
  undefined1 uStack_1c0;
  undefined1 uStack_1bf;
  uchar uStack_1be;
  byte bStack_1bd;
  undefined1 uStack_1bc;
  undefined1 uStack_1bb;
  uchar uStack_1ba;
  byte bStack_1b9;
  SmallVectorBase<const_slang::syntax::OrderedParamAssignmentSyntax_*> local_1b8 [2];
  undefined1 local_178 [264];
  undefined1 local_70 [32];
  value_type_pointer local_50;
  Info *local_48;
  Info *local_40;
  
  local_284 = (int)CONCAT71(in_register_00000011,isFromConfig);
  if ((local_284 != 0) && ((syntax->parameters).elements._M_extent._M_extent_value == 0)) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_256UL,_16UL>_>
    ::clear((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_256UL,_16UL>_>
             *)&(this->assignments).super_Storage.field_0x108);
    return;
  }
  local_1b8[0].data_ = (pointer)local_1b8[0].firstElement;
  local_1b8[0].len = 0;
  local_1b8[0].cap = 5;
  pPVar27 = syntax;
  SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>,_8UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL,_16UL>_>
  ::SmallMap((SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>,_8UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL,_16UL>_>
              *)local_178);
  local_2b8 = (ParameterValueAssignmentSyntax *)&syntax->parameters;
  local_258.index = 0;
  local_290 = (NamedParamAssignmentSyntax *)
              ((syntax->parameters).elements._M_extent._M_extent_value + 1 >> 1);
  uVar29 = 1;
  bVar15 = false;
  local_2b0 = this;
  local_258.list = (ParentList *)local_2b8;
  do {
    if (((ParameterValueAssignmentSyntax *)local_258.list == local_2b8) &&
       ((NamedParamAssignmentSyntax *)local_258.index == local_290)) goto LAB_0038e115;
    pNVar18 = (NamedParamAssignmentSyntax *)
              slang::syntax::SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax>::
              iterator_base<const_slang::syntax::ParamAssignmentSyntax_*>::dereference(&local_258);
    SVar3 = (pNVar18->super_ParamAssignmentSyntax).super_SyntaxNode.kind;
    if (bVar15) {
      if ((SVar3 == OrderedParamAssignment) != (bool)((byte)uVar29 & 1)) goto LAB_0038e0e9;
    }
    else {
      uVar29 = (ulong)(SVar3 == OrderedParamAssignment);
    }
    if (SVar3 == OrderedParamAssignment) {
      local_280._0_8_ = pNVar18;
      pPVar27 = (ParameterValueAssignmentSyntax *)local_280;
      SmallVectorBase<slang::syntax::OrderedParamAssignmentSyntax_const*>::
      emplace_back<slang::syntax::OrderedParamAssignmentSyntax_const*>
                ((SmallVectorBase<slang::syntax::OrderedParamAssignmentSyntax_const*> *)local_1b8,
                 (OrderedParamAssignmentSyntax **)pPVar27);
    }
    else {
      local_218 = parsing::Token::valueText(&pNVar18->name);
      if (local_218._M_len != 0) {
        local_208.second = false;
        local_208.first = pNVar18;
        uVar20 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                           ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                            local_70,&local_218);
        pNVar25 = (NamedParamAssignmentSyntax *)(uVar20 >> (local_70[8] & 0x3f));
        lVar28 = (uVar20 & 0xff) * 4;
        uVar39 = (&UNK_003fea9c)[lVar28];
        uVar40 = (&UNK_003fea9d)[lVar28];
        uVar41 = (&UNK_003fea9e)[lVar28];
        NVar42.raw = (&UNK_003fea9f)[lVar28];
        uVar26 = (ulong)((uint)uVar20 & 7);
        pSVar24 = (SyntaxNode *)0x0;
        local_2a8 = (NamedParamAssignmentSyntax *)CONCAT71(local_2a8._1_7_,(char)uVar29);
        pNVar23 = pNVar25;
        uVar43 = uVar39;
        uVar44 = uVar40;
        uVar46 = uVar41;
        bVar48 = NVar42.raw;
        uVar49 = uVar39;
        uVar52 = uVar40;
        uVar55 = uVar41;
        bVar58 = NVar42.raw;
        uVar60 = uVar39;
        uVar63 = uVar40;
        uVar66 = uVar41;
        bVar69 = NVar42.raw;
        do {
          ppVar13 = local_50;
          uVar12 = local_70._24_8_;
          pgVar1 = (group_type_pointer)(local_70._24_8_ + pNVar23 * 0x10);
          local_1c8 = pgVar1->m[0].n;
          uStack_1c7 = pgVar1->m[1].n;
          uStack_1c6 = pgVar1->m[2].n;
          bStack_1c5 = pgVar1->m[3].n;
          uStack_1c4 = pgVar1->m[4].n;
          uStack_1c3 = pgVar1->m[5].n;
          uStack_1c2 = pgVar1->m[6].n;
          bStack_1c1 = pgVar1->m[7].n;
          uStack_1c0 = pgVar1->m[8].n;
          uStack_1bf = pgVar1->m[9].n;
          uStack_1be = pgVar1->m[10].n;
          bStack_1bd = pgVar1->m[0xb].n;
          uStack_1bc = pgVar1->m[0xc].n;
          uStack_1bb = pgVar1->m[0xd].n;
          uStack_1ba = pgVar1->m[0xe].n;
          bVar14 = pgVar1->m[0xf].n;
          auVar35[0] = -(local_1c8 == uVar39);
          auVar35[1] = -(uStack_1c7 == uVar40);
          auVar35[2] = -(uStack_1c6 == uVar41);
          auVar35[3] = -(bStack_1c5 == NVar42.raw);
          auVar35[4] = -(uStack_1c4 == uVar43);
          auVar35[5] = -(uStack_1c3 == uVar44);
          auVar35[6] = -(uStack_1c2 == uVar46);
          auVar35[7] = -(bStack_1c1 == bVar48);
          auVar35[8] = -(uStack_1c0 == uVar49);
          auVar35[9] = -(uStack_1bf == uVar52);
          auVar35[10] = -(uStack_1be == uVar55);
          auVar35[0xb] = -(bStack_1bd == bVar58);
          auVar35[0xc] = -(uStack_1bc == uVar60);
          auVar35[0xd] = -(uStack_1bb == uVar63);
          auVar35[0xe] = -(uStack_1ba == uVar66);
          auVar35[0xf] = -(bVar14 == bVar69);
          uVar17 = (uint)(ushort)((ushort)(SUB161(auVar35 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar35 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar35 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar35 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar35 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar35 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar35 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar35 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar35 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar35 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar35 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar35 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar35 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar35 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar35 >> 0x77,0) & 1) << 0xe);
          bStack_1b9 = bVar14;
          if (uVar17 != 0) {
            stack0xfffffffffffffd98 =
                 (ParameterValueAssignmentSyntax *)
                 CONCAT17(bVar48,CONCAT16(uVar46,CONCAT15(uVar44,CONCAT14(uVar43,CONCAT13(NVar42.raw
                                                                                          ,CONCAT12(
                                                  uVar41,CONCAT11(uVar40,uVar39)))))));
            local_2a0 = uVar20;
            local_298 = uVar26;
            uStack_260 = uVar49;
            uStack_25f = uVar52;
            uStack_25e = uVar55;
            bStack_25d = bVar58;
            uStack_25c = uVar60;
            uStack_25b = uVar63;
            uStack_25a = uVar66;
            bStack_259 = bVar69;
            local_248 = pSVar24;
            local_238 = pNVar23;
            do {
              iVar8 = 0;
              if (uVar17 != 0) {
                for (; (uVar17 >> iVar8 & 1) == 0; iVar8 = iVar8 + 1) {
                }
              }
              pbVar32 = (basic_string_view<char,_std::char_traits<char>_> *)
                        ((long)&ppVar13[(long)pNVar23 * 0xf].first._M_len +
                        (ulong)(uint)(iVar8 << 5));
              bVar15 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                       operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                   *)local_70,&local_218,pbVar32);
              this = local_2b0;
              if (bVar15) {
                pSVar4 = local_2b0->scope;
                SVar19 = parsing::Token::location(&pNVar18->name);
                uVar29 = (ulong)local_2a8 & 0xff;
                pDVar21 = Scope::addDiag(pSVar4,(DiagCode)0x320006,SVar19);
                Diagnostic::operator<<(pDVar21,local_218);
                SVar19 = parsing::Token::location((Token *)(pbVar32[1]._M_len + 0x28));
                pPVar27 = (ParameterValueAssignmentSyntax *)0xc0001;
                Diagnostic::addNote(pDVar21,(DiagCode)0xc0001,SVar19);
                goto LAB_0038e09f;
              }
              uVar17 = uVar17 - 1 & uVar17;
            } while (uVar17 != 0);
            bVar14 = ((group_type_pointer)(uVar12 + pNVar23 * 0x10))->m[0xf].n;
            pNVar23 = local_238;
            pSVar24 = local_248;
            uVar26 = local_298;
            uVar20 = local_2a0;
            uVar39 = local_280[0x18];
            uVar40 = uStack_267;
            uVar41 = uStack_266;
            NVar42.raw = NStack_265.raw;
            uVar43 = uStack_264;
            uVar44 = uStack_263;
            uVar46 = uStack_262;
            bVar48 = bStack_261;
            uVar49 = uStack_260;
            uVar52 = uStack_25f;
            uVar55 = uStack_25e;
            bVar58 = bStack_25d;
            uVar60 = uStack_25c;
            uVar63 = uStack_25b;
            uVar66 = uStack_25a;
            bVar69 = bStack_259;
          }
          uVar29 = (ulong)local_2a8 & 0xff;
          if (((&boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::
                 is_not_overflowed(unsigned_long)::shift)[uVar26] & bVar14) == 0) break;
          pSVar9 = &pSVar24->kind;
          pSVar24 = (SyntaxNode *)((long)&pSVar24->kind + 1);
          pNVar23 = (NamedParamAssignmentSyntax *)
                    ((ulong)((long)pSVar9 + (long)((long)&pNVar23->super_ParamAssignmentSyntax + 1))
                    & local_70._16_8_);
        } while (pSVar24 <= (ulong)local_70._16_8_);
        if (local_40 < local_48) {
          pPVar27 = (ParameterValueAssignmentSyntax *)local_70;
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>,256ul,16ul>>
          ::
          unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>
                    ((locator *)local_280,
                     (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>,256ul,16ul>>
                      *)pPVar27,(size_t)pNVar25,uVar20,&local_2b9,&local_218,&local_208);
          this = local_2b0;
        }
        else {
          pPVar27 = (ParameterValueAssignmentSyntax *)local_70;
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>,256ul,16ul>>
          ::
          unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>
                    ((locator *)local_280,
                     (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>,256ul,16ul>>
                      *)pPVar27,uVar20,&local_2b9,&local_218,&local_208);
          this = local_2b0;
        }
      }
    }
LAB_0038e09f:
    local_258.index = (long)(anon_union_8_3_62382250_for_ParameterDecl_0 *)local_258.index + 1;
    bVar15 = true;
  } while( true );
  while( true ) {
    pTVar7 = *(pointer *)&(local_2b0->assignments).field_0x118;
    pCVar10 = &pTVar31->super_ConstTokenOrSyntax;
    pTVar31 = (pointer)((long)&(pTVar31->super_ConstTokenOrSyntax).
                               super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                               .
                               super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                               .
                               super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                               .
                               super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                               .
                               super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                               .
                               super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                       + 1);
    uVar30 = (long)&(pCVar10->
                    super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
                    super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                    super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                    .
                    super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                    .
                    super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                    .
                    super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
             + uVar30 + 1 & (ulong)pTVar7;
    if (pTVar7 < pTVar31) break;
LAB_0038e552:
    lVar28 = *(long *)&(local_2b0->assignments).field_0x120;
    pcVar2 = (char *)(lVar28 + uVar30 * 0x10);
    local_1e8 = *pcVar2;
    uStack_1e7 = pcVar2[1];
    uStack_1e6 = pcVar2[2];
    uStack_1e5 = pcVar2[3];
    uStack_1e4 = pcVar2[4];
    uStack_1e3 = pcVar2[5];
    uStack_1e2 = pcVar2[6];
    uStack_1e1 = pcVar2[7];
    uStack_1e0 = pcVar2[8];
    uStack_1df = pcVar2[9];
    uStack_1de = pcVar2[10];
    uStack_1dd = pcVar2[0xb];
    uStack_1dc = pcVar2[0xc];
    uStack_1db = pcVar2[0xd];
    uStack_1da = pcVar2[0xe];
    uVar22 = pcVar2[0xf];
    auVar38[0] = -(local_1e8 == uVar39);
    auVar38[1] = -(uStack_1e7 == uVar40);
    auVar38[2] = -(uStack_1e6 == uVar43);
    auVar38[3] = -(uStack_1e5 == uVar44);
    auVar38[4] = -(uStack_1e4 == uVar49);
    auVar38[5] = -(uStack_1e3 == uVar52);
    auVar38[6] = -(uStack_1e2 == uVar60);
    auVar38[7] = -(uStack_1e1 == uVar63);
    auVar38[8] = -(uStack_1e0 == uVar50);
    auVar38[9] = -(uStack_1df == uVar53);
    auVar38[10] = -(uStack_1de == uVar56);
    auVar38[0xb] = -(uStack_1dd == uVar59);
    auVar38[0xc] = -(uStack_1dc == uVar61);
    auVar38[0xd] = -(uStack_1db == uVar64);
    auVar38[0xe] = -(uStack_1da == uVar67);
    auVar38[0xf] = -(uVar22 == uVar70);
    uVar17 = (uint)(ushort)((ushort)(SUB161(auVar38 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar38 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar38 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar38 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar38 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar38 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar38 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar38 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar38 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar38 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar38 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar38 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar38 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar38 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar38 >> 0x77,0) & 1) << 0xe);
    uStack_1d9 = uVar22;
    if (uVar17 != 0) {
      local_248._0_2_ = CONCAT11(uVar40,uVar39);
      local_248._0_3_ = CONCAT12(uVar43,(undefined2)local_248);
      local_248._0_4_ = CONCAT13(uVar44,(undefined3)local_248);
      local_248._0_5_ = CONCAT14(uVar49,(undefined4)local_248);
      local_248._0_6_ = CONCAT15(uVar52,(undefined5)local_248);
      local_248._0_7_ = CONCAT16(uVar60,(undefined6)local_248);
      local_248 = (SyntaxNode *)CONCAT17(uVar63,(undefined7)local_248);
      lVar5 = *(long *)&(local_2b0->assignments).field_0x128;
      local_2a0 = uVar30;
      local_298 = uVar29;
      uStack_240 = uVar50;
      uStack_23f = uVar53;
      uStack_23e = uVar56;
      uStack_23d = uVar59;
      uStack_23c = uVar61;
      uStack_23b = uVar64;
      uStack_23a = uVar67;
      uStack_239 = uVar70;
      local_228 = uVar20;
      local_220 = pTVar31;
      do {
        iVar8 = 0;
        if (uVar17 != 0) {
          for (; (uVar17 >> iVar8 & 1) == 0; iVar8 = iVar8 + 1) {
          }
        }
        ppVar33 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>
                   *)((ulong)(uint)(iVar8 << 5) + lVar5 + uVar30 * 0x1e0);
        pPVar27 = local_2b8;
        bVar15 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                           ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                            stack0xfffffffffffffd98,
                            (basic_string_view<char,_std::char_traits<char>_> *)local_2b8,
                            (basic_string_view<char,_std::char_traits<char>_> *)ppVar33);
        if (bVar15) goto LAB_0038e68a;
        uVar17 = uVar17 - 1 & uVar17;
      } while (uVar17 != 0);
      uVar22 = *(byte *)(lVar28 + uVar30 * 0x10 + 0xf);
      uVar20 = local_228;
      uVar29 = local_298;
      uVar30 = local_2a0;
      pTVar31 = local_220;
      pPVar34 = local_2b8;
      uVar39 = (undefined1)local_248;
      uVar40 = local_248._1_1_;
      uVar43 = local_248._2_1_;
      uVar44 = local_248._3_1_;
      uVar49 = local_248._4_1_;
      uVar52 = local_248._5_1_;
      uVar60 = local_248._6_1_;
      uVar63 = local_248._7_1_;
      uVar50 = uStack_240;
      uVar53 = uStack_23f;
      uVar56 = uStack_23e;
      uVar59 = uStack_23d;
      uVar61 = uStack_23c;
      uVar64 = uStack_23b;
      uVar67 = uStack_23a;
      uVar70 = uStack_239;
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[uVar29] & uVar22) == Unknown >> 0x18) break;
  }
  pPVar27 = stack0xfffffffffffffd98;
  if (*(ulong *)&(local_2b0->assignments).field_0x138 <
      *(ulong *)&(local_2b0->assignments).field_0x130) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>,256ul,16ul>>
    ::
    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&>
              ((locator *)local_280,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>,256ul,16ul>>
                *)stack0xfffffffffffffd98,uVar26,uVar20,(try_emplace_args_t *)&local_258,
               (basic_string_view<char,_std::char_traits<char>_> *)pPVar34);
    ppVar33 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>
               *)local_280._16_8_;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>,256ul,16ul>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&>
              ((locator *)local_280,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>,256ul,16ul>>
                *)stack0xfffffffffffffd98,uVar20,(try_emplace_args_t *)&local_258,
               (basic_string_view<char,_std::char_traits<char>_> *)pPVar34);
    ppVar33 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>
               *)local_280._16_8_;
  }
LAB_0038e68a:
  (ppVar33->second).first = local_238;
  (ppVar33->second).second = SUB41(local_284,0);
LAB_0038e69e:
  pNVar18 = (NamedParamAssignmentSyntax *)&(pNVar18->openParen).info;
  this = local_2b0;
  goto LAB_0038e36f;
LAB_0038e0e9:
  pSVar4 = this->scope;
  local_280._0_16_ =
       (undefined1  [16])slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)pNVar18);
  SVar19 = parsing::Token::location((Token *)local_280);
  pPVar27 = (ParameterValueAssignmentSyntax *)0x7f0006;
  Scope::addDiag(pSVar4,(DiagCode)0x7f0006,SVar19);
LAB_0038e115:
  if ((uVar29 & 1) == 0) {
    pNVar18 = (NamedParamAssignmentSyntax *)(this->parameterDecls)._M_ptr;
    local_290 = (NamedParamAssignmentSyntax *)
                ((anon_union_8_3_62382250_for_ParameterDecl_0 *)
                 &pNVar18->super_ParamAssignmentSyntax +
                (this->parameterDecls)._M_extent._M_extent_value * 8);
    unique0x00004880 =
         (ParameterValueAssignmentSyntax *)&(this->assignments).super_Storage.field_0x108;
LAB_0038e36f:
    if (pNVar18 != local_290) {
      pPVar34 = (ParameterValueAssignmentSyntax *)
                ((anon_union_8_3_62382250_for_ParameterDecl_0 *)
                 &pNVar18->super_ParamAssignmentSyntax + 2);
      pPVar27 = pPVar34;
      uVar20 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                         ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                          local_70,(basic_string_view<char,_std::char_traits<char>_> *)pPVar34);
      uVar29 = uVar20 >> (local_70[8] & 0x3f);
      lVar28 = (uVar20 & 0xff) * 4;
      uVar41 = (&UNK_003fea9c)[lVar28];
      uVar46 = (&UNK_003fea9d)[lVar28];
      uVar55 = (&UNK_003fea9e)[lVar28];
      bVar48 = (&UNK_003fea9f)[lVar28];
      pSVar24 = (SyntaxNode *)0x0;
      uVar66 = uVar41;
      uVar45 = uVar46;
      uVar47 = uVar55;
      bVar58 = bVar48;
      uVar51 = uVar41;
      uVar54 = uVar46;
      uVar57 = uVar55;
      bVar69 = bVar48;
      uVar62 = uVar41;
      uVar65 = uVar46;
      uVar68 = uVar55;
      bVar14 = bVar48;
      do {
        ppVar13 = local_50;
        uVar12 = local_70._24_8_;
        pgVar1 = (group_type_pointer)(local_70._24_8_ + uVar29 * 0x10);
        local_1d8 = pgVar1->m[0].n;
        uStack_1d7 = pgVar1->m[1].n;
        uStack_1d6 = pgVar1->m[2].n;
        bStack_1d5 = pgVar1->m[3].n;
        uStack_1d4 = pgVar1->m[4].n;
        uStack_1d3 = pgVar1->m[5].n;
        uStack_1d2 = pgVar1->m[6].n;
        bStack_1d1 = pgVar1->m[7].n;
        uStack_1d0 = pgVar1->m[8].n;
        uStack_1cf = pgVar1->m[9].n;
        uStack_1ce = pgVar1->m[10].n;
        bStack_1cd = pgVar1->m[0xb].n;
        uStack_1cc = pgVar1->m[0xc].n;
        uStack_1cb = pgVar1->m[0xd].n;
        uStack_1ca = pgVar1->m[0xe].n;
        bVar16 = pgVar1->m[0xf].n;
        auVar37[0] = -(local_1d8 == uVar41);
        auVar37[1] = -(uStack_1d7 == uVar46);
        auVar37[2] = -(uStack_1d6 == uVar55);
        auVar37[3] = -(bStack_1d5 == bVar48);
        auVar37[4] = -(uStack_1d4 == uVar66);
        auVar37[5] = -(uStack_1d3 == uVar45);
        auVar37[6] = -(uStack_1d2 == uVar47);
        auVar37[7] = -(bStack_1d1 == bVar58);
        auVar37[8] = -(uStack_1d0 == uVar51);
        auVar37[9] = -(uStack_1cf == uVar54);
        auVar37[10] = -(uStack_1ce == uVar57);
        auVar37[0xb] = -(bStack_1cd == bVar69);
        auVar37[0xc] = -(uStack_1cc == uVar62);
        auVar37[0xd] = -(uStack_1cb == uVar65);
        auVar37[0xe] = -(uStack_1ca == uVar68);
        auVar37[0xf] = -(bVar16 == bVar14);
        uVar17 = (uint)(ushort)((ushort)(SUB161(auVar37 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar37 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar37 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar37 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar37 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar37 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar37 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar37 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar37 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar37 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar37 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar37 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar37 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar37 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar37 >> 0x77,0) & 1) << 0xe);
        bStack_1c9 = bVar16;
        if (uVar17 != 0) {
          local_238 = (NamedParamAssignmentSyntax *)
                      CONCAT17(bVar58,CONCAT16(uVar47,CONCAT15(uVar45,CONCAT14(uVar66,CONCAT13(
                                                  bVar48,CONCAT12(uVar55,CONCAT11(uVar46,uVar41)))))
                                              ));
          local_2b8 = pPVar34;
          local_2a8 = pNVar18;
          local_248 = pSVar24;
          uStack_230 = uVar51;
          uStack_22f = uVar54;
          uStack_22e = uVar57;
          bStack_22d = bVar69;
          uStack_22c = uVar62;
          uStack_22b = uVar65;
          uStack_22a = uVar68;
          bStack_229 = bVar14;
          do {
            iVar8 = 0;
            if (uVar17 != 0) {
              for (; (uVar17 >> iVar8 & 1) == 0; iVar8 = iVar8 + 1) {
              }
            }
            pbVar32 = (basic_string_view<char,_std::char_traits<char>_> *)
                      ((long)&ppVar13[uVar29 * 0xf].first._M_len + (ulong)(uint)(iVar8 << 5));
            pPVar27 = local_2b8;
            bVar15 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                     operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                                local_70,(basic_string_view<char,_std::char_traits<char>_> *)
                                         local_2b8,pbVar32);
            pNVar18 = local_2a8;
            pPVar34 = local_2b8;
            if (bVar15) {
              *(undefined1 *)&pbVar32[1]._M_str = 1;
              if (*(bool *)((long)&(local_2a8->openParen).kind + 1) != true) {
                local_238 = *(NamedParamAssignmentSyntax **)(pbVar32[1]._M_len + 0x48);
                uVar20 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::
                         operator()((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>
                                     *)stack0xfffffffffffffd98,
                                    (basic_string_view<char,_std::char_traits<char>_> *)local_2b8);
                uVar26 = uVar20 >> ((local_2b0->assignments).field_0x110 & 0x3f);
                lVar28 = (uVar20 & 0xff) * 4;
                uVar39 = (&UNK_003fea9c)[lVar28];
                uVar40 = (&UNK_003fea9d)[lVar28];
                uVar43 = (&UNK_003fea9e)[lVar28];
                uVar44 = (&UNK_003fea9f)[lVar28];
                uVar29 = (ulong)((uint)uVar20 & 7);
                pTVar31 = (pointer)0x0;
                uVar30 = uVar26;
                uVar49 = uVar39;
                uVar52 = uVar40;
                uVar60 = uVar43;
                uVar63 = uVar44;
                uVar50 = uVar39;
                uVar53 = uVar40;
                uVar56 = uVar43;
                uVar59 = uVar44;
                uVar61 = uVar39;
                uVar64 = uVar40;
                uVar67 = uVar43;
                uVar70 = uVar44;
                goto LAB_0038e552;
              }
              bVar15 = (bool)(local_2a8->openParen).field_0x2;
              pSVar4 = local_2b0->scope;
              SVar19 = parsing::Token::location((Token *)(pbVar32[1]._M_len + 0x28));
              pDVar21 = Scope::addDiag(pSVar4,(DiagCode)((uint)bVar15 * 0x10000 + 0x30006),SVar19);
              pPVar27 = (ParameterValueAssignmentSyntax *)0x50001;
              Diagnostic::addNote(pDVar21,(DiagCode)0x50001,(SourceLocation)(pNVar18->dot).info);
              goto LAB_0038e69e;
            }
            uVar17 = uVar17 - 1 & uVar17;
          } while (uVar17 != 0);
          bVar16 = ((group_type_pointer)(uVar12 + uVar29 * 0x10))->m[0xf].n;
          pSVar24 = local_248;
          uVar41 = (uchar)local_238;
          uVar46 = local_238._1_1_;
          uVar55 = local_238._2_1_;
          bVar48 = local_238._3_1_;
          uVar66 = local_238._4_1_;
          uVar45 = local_238._5_1_;
          uVar47 = local_238._6_1_;
          bVar58 = local_238._7_1_;
          uVar51 = uStack_230;
          uVar54 = uStack_22f;
          uVar57 = uStack_22e;
          bVar69 = bStack_22d;
          uVar62 = uStack_22c;
          uVar65 = uStack_22b;
          uVar68 = uStack_22a;
          bVar14 = bStack_229;
        }
        if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
               ::is_not_overflowed(unsigned_long)::shift)[(uint)uVar20 & 7] & bVar16) == 0) break;
        pSVar9 = &pSVar24->kind;
        pSVar24 = (SyntaxNode *)((long)&pSVar24->kind + 1);
        uVar29 = (long)pSVar9 + uVar29 + 1 & local_70._16_8_;
      } while (pSVar24 <= (ulong)local_70._16_8_);
      goto LAB_0038e69e;
    }
    local_280._0_16_ =
         (undefined1  [16])
         boost::unordered::detail::foa::
         table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL,_16UL>_>
         ::begin((table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL,_16UL>_>
                  *)local_70);
    while ((table_element_pointer)local_280._8_8_ != (table_element_pointer)0x0) {
      if (((((table_element_pointer)local_280._8_8_)->second).second & 1U) == 0) {
        pSVar4 = this->scope;
        this_00 = &((((table_element_pointer)local_280._8_8_)->second).first)->name;
        SVar19 = parsing::Token::location(this_00);
        pDVar21 = Scope::addDiag(pSVar4,(DiagCode)0x990006,SVar19);
        arg = parsing::Token::valueText(this_00);
        Diagnostic::operator<<(pDVar21,arg);
        pPVar27 = (ParameterValueAssignmentSyntax *)(this->definitionName)._M_len;
        Diagnostic::operator<<(pDVar21,this->definitionName);
      }
      boost::unordered::detail::foa::
      table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
      ::increment((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                   *)local_280);
    }
  }
  else {
    pNVar18 = (NamedParamAssignmentSyntax *)(this->parameterDecls)._M_ptr;
    pNVar23 = (NamedParamAssignmentSyntax *)
              ((anon_union_8_3_62382250_for_ParameterDecl_0 *)&pNVar18->super_ParamAssignmentSyntax
              + (this->parameterDecls)._M_extent._M_extent_value * 8);
    local_2b8 = (ParameterValueAssignmentSyntax *)&(this->assignments).super_Storage.field_0x108;
    pNVar25 = (NamedParamAssignmentSyntax *)0x0;
    local_238 = pNVar23;
    while( true ) {
      pPVar11 = local_2b0;
      uVar29 = (ulong)pNVar25 & 0xffffffff;
      if ((pNVar18 == pNVar23) || (local_1b8[0].len <= uVar29)) break;
      if (*(bool *)((long)&(pNVar18->openParen).kind + 1) == false) {
        local_2a8 = (NamedParamAssignmentSyntax *)(ulong)((uint)pNVar25 + 1);
        local_290 = *(NamedParamAssignmentSyntax **)
                     (*(long *)((long)local_1b8[0].data_ + uVar29 * 8) + 0x18);
        pPVar34 = (ParameterValueAssignmentSyntax *)
                  ((anon_union_8_3_62382250_for_ParameterDecl_0 *)
                   &pNVar18->super_ParamAssignmentSyntax + 2);
        uVar20 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                           ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                            local_2b8,(basic_string_view<char,_std::char_traits<char>_> *)pPVar34);
        uVar26 = uVar20 >> ((local_2b0->assignments).field_0x110 & 0x3f);
        lVar28 = (uVar20 & 0xff) * 4;
        uVar39 = (&UNK_003fea9c)[lVar28];
        uVar40 = (&UNK_003fea9d)[lVar28];
        uVar43 = (&UNK_003fea9e)[lVar28];
        uVar44 = (&UNK_003fea9f)[lVar28];
        pTVar31 = (pointer)(ulong)((uint)uVar20 & 7);
        uVar30 = 0;
        uVar29 = uVar26;
        uVar49 = uVar39;
        uVar52 = uVar40;
        uVar60 = uVar43;
        uVar63 = uVar44;
        uVar50 = uVar39;
        uVar53 = uVar40;
        uVar56 = uVar43;
        uVar59 = uVar44;
        uVar61 = uVar39;
        uVar64 = uVar40;
        uVar67 = uVar43;
        uVar70 = uVar44;
        do {
          lVar28 = *(long *)&(local_2b0->assignments).field_0x120;
          pcVar2 = (char *)(lVar28 + uVar29 * 0x10);
          local_1f8 = *pcVar2;
          uStack_1f7 = pcVar2[1];
          uStack_1f6 = pcVar2[2];
          uStack_1f5 = pcVar2[3];
          uStack_1f4 = pcVar2[4];
          uStack_1f3 = pcVar2[5];
          uStack_1f2 = pcVar2[6];
          uStack_1f1 = pcVar2[7];
          uStack_1f0 = pcVar2[8];
          uStack_1ef = pcVar2[9];
          uStack_1ee = pcVar2[10];
          uStack_1ed = pcVar2[0xb];
          uStack_1ec = pcVar2[0xc];
          uStack_1eb = pcVar2[0xd];
          uStack_1ea = pcVar2[0xe];
          uVar22 = pcVar2[0xf];
          auVar36[0] = -(local_1f8 == uVar39);
          auVar36[1] = -(uStack_1f7 == uVar40);
          auVar36[2] = -(uStack_1f6 == uVar43);
          auVar36[3] = -(uStack_1f5 == uVar44);
          auVar36[4] = -(uStack_1f4 == uVar49);
          auVar36[5] = -(uStack_1f3 == uVar52);
          auVar36[6] = -(uStack_1f2 == uVar60);
          auVar36[7] = -(uStack_1f1 == uVar63);
          auVar36[8] = -(uStack_1f0 == uVar50);
          auVar36[9] = -(uStack_1ef == uVar53);
          auVar36[10] = -(uStack_1ee == uVar56);
          auVar36[0xb] = -(uStack_1ed == uVar59);
          auVar36[0xc] = -(uStack_1ec == uVar61);
          auVar36[0xd] = -(uStack_1eb == uVar64);
          auVar36[0xe] = -(uStack_1ea == uVar67);
          auVar36[0xf] = -(uVar22 == uVar70);
          uVar17 = (uint)(ushort)((ushort)(SUB161(auVar36 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar36 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar36 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar36 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar36 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar36 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar36 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar36 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar36 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar36 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar36 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar36 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar36 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar36 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar36 >> 0x77,0) & 1) << 0xe);
          uStack_1e9 = uVar22;
          if (uVar17 != 0) {
            local_248._0_2_ = CONCAT11(uVar40,uVar39);
            local_248._0_3_ = CONCAT12(uVar43,(undefined2)local_248);
            local_248._0_4_ = CONCAT13(uVar44,(undefined3)local_248);
            local_248._0_5_ = CONCAT14(uVar49,(undefined4)local_248);
            local_248._0_6_ = CONCAT15(uVar52,(undefined5)local_248);
            local_248._0_7_ = CONCAT16(uVar60,(undefined6)local_248);
            local_248 = (SyntaxNode *)CONCAT17(uVar63,(undefined7)local_248);
            lVar5 = *(long *)&(local_2b0->assignments).field_0x128;
            local_2a0 = uVar30;
            local_298 = uVar29;
            unique0x10001dcc = pPVar34;
            uStack_240 = uVar50;
            uStack_23f = uVar53;
            uStack_23e = uVar56;
            uStack_23d = uVar59;
            uStack_23c = uVar61;
            uStack_23b = uVar64;
            uStack_23a = uVar67;
            uStack_239 = uVar70;
            local_228 = uVar20;
            local_220 = pTVar31;
            do {
              iVar8 = 0;
              if (uVar17 != 0) {
                for (; (uVar17 >> iVar8 & 1) == 0; iVar8 = iVar8 + 1) {
                }
              }
              ppVar33 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>
                         *)((ulong)(uint)(iVar8 << 5) + lVar5 + uVar29 * 0x1e0);
              pPVar27 = stack0xfffffffffffffd98;
              bVar15 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                       operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                   *)local_2b8,
                                  (basic_string_view<char,_std::char_traits<char>_> *)
                                  stack0xfffffffffffffd98,
                                  (basic_string_view<char,_std::char_traits<char>_> *)ppVar33);
              if (bVar15) goto LAB_0038e30a;
              uVar17 = uVar17 - 1 & uVar17;
            } while (uVar17 != 0);
            uVar22 = *(byte *)(lVar28 + uVar29 * 0x10 + 0xf);
            uVar20 = local_228;
            uVar29 = local_298;
            uVar30 = local_2a0;
            pTVar31 = local_220;
            pPVar34 = stack0xfffffffffffffd98;
            uVar39 = (undefined1)local_248;
            uVar40 = local_248._1_1_;
            uVar43 = local_248._2_1_;
            uVar44 = local_248._3_1_;
            uVar49 = local_248._4_1_;
            uVar52 = local_248._5_1_;
            uVar60 = local_248._6_1_;
            uVar63 = local_248._7_1_;
            uVar50 = uStack_240;
            uVar53 = uStack_23f;
            uVar56 = uStack_23e;
            uVar59 = uStack_23d;
            uVar61 = uStack_23c;
            uVar64 = uStack_23b;
            uVar67 = uStack_23a;
            uVar70 = uStack_239;
          }
          if ((*(__index_type *)
                ((long)&pTVar31[0x2a9f0].super_ConstTokenOrSyntax.
                        super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                        super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                        .
                        super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                        .
                        super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                        .
                        super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                        .
                        super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                + 0x10) & uVar22) == Unknown >> 0x18) break;
          uVar6 = *(ulong *)&(local_2b0->assignments).field_0x118;
          lVar28 = uVar29 + uVar30;
          uVar30 = uVar30 + 1;
          uVar29 = lVar28 + 1U & uVar6;
        } while (uVar30 <= uVar6);
        pPVar27 = local_2b8;
        if (*(ulong *)&(local_2b0->assignments).field_0x138 <
            *(ulong *)&(local_2b0->assignments).field_0x130) {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>,256ul,16ul>>
          ::
          unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&>
                    ((locator *)local_280,
                     (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>,256ul,16ul>>
                      *)local_2b8,uVar26,uVar20,(try_emplace_args_t *)&local_258,
                     (basic_string_view<char,_std::char_traits<char>_> *)pPVar34);
          ppVar33 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>
                     *)local_280._16_8_;
        }
        else {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>,256ul,16ul>>
          ::
          unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&>
                    ((locator *)local_280,
                     (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>,256ul,16ul>>
                      *)local_2b8,uVar20,(try_emplace_args_t *)&local_258,
                     (basic_string_view<char,_std::char_traits<char>_> *)pPVar34);
          ppVar33 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>
                     *)local_280._16_8_;
        }
LAB_0038e30a:
        (ppVar33->second).first = local_290;
        (ppVar33->second).second = SUB41(local_284,0);
        pNVar23 = local_238;
        pNVar25 = local_2a8;
      }
      pNVar18 = (NamedParamAssignmentSyntax *)&(pNVar18->openParen).info;
    }
    if (uVar29 < local_1b8[0].len) {
      local_280._0_16_ =
           (undefined1  [16])
           slang::syntax::SyntaxNode::getFirstToken
                     (*(SyntaxNode **)((long)local_1b8[0].data_ + uVar29 * 8));
      SVar19 = parsing::Token::location((Token *)local_280);
      pDVar21 = Scope::addDiag(pPVar11->scope,(DiagCode)0xc70006,SVar19);
      Diagnostic::operator<<(pDVar21,pPVar11->definitionName);
      Diagnostic::operator<<<unsigned_long>(pDVar21,local_1b8[0].len);
      pPVar27 = (ParameterValueAssignmentSyntax *)((ulong)pNVar25 & 0xffffffff);
      Diagnostic::operator<<<unsigned_int>(pDVar21,(uint)pNVar25);
    }
  }
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL,_16UL>_>
  ::~table_core((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL,_16UL>_>
                 *)local_70);
  SmallVectorBase<const_slang::syntax::OrderedParamAssignmentSyntax_*>::cleanup
            (local_1b8,(EVP_PKEY_CTX *)pPVar27);
  return;
}

Assistant:

void ParameterBuilder::setAssignments(const ParameterValueAssignmentSyntax& syntax,
                                      bool isFromConfig) {
    // Special case for config param assignments: if the assignment
    // syntax list is empty, we set all params back to their defaults.
    if (isFromConfig && syntax.parameters.empty()) {
        assignments.clear();
        return;
    }

    // Build up data structures to easily index the parameter assignments. We need to handle
    // both ordered assignment as well as named assignment, though a specific instance can only
    // use one method or the other.
    bool hasParamAssignments = false;
    bool orderedAssignments = true;
    SmallVector<const OrderedParamAssignmentSyntax*> orderedParams;
    SmallMap<std::string_view, std::pair<const NamedParamAssignmentSyntax*, bool>, 8> namedParams;

    for (auto paramBase : syntax.parameters) {
        bool isOrdered = paramBase->kind == SyntaxKind::OrderedParamAssignment;
        if (!hasParamAssignments) {
            hasParamAssignments = true;
            orderedAssignments = isOrdered;
        }
        else if (isOrdered != orderedAssignments) {
            scope.addDiag(diag::MixingOrderedAndNamedParams, paramBase->getFirstToken().location());
            break;
        }

        if (isOrdered)
            orderedParams.push_back(&paramBase->as<OrderedParamAssignmentSyntax>());
        else {
            auto& nas = paramBase->as<NamedParamAssignmentSyntax>();
            auto name = nas.name.valueText();
            if (!name.empty()) {
                auto pair = namedParams.emplace(name, std::make_pair(&nas, false));
                if (!pair.second) {
                    auto& diag = scope.addDiag(diag::DuplicateParamAssignment, nas.name.location());
                    diag << name;
                    diag.addNote(diag::NotePreviousUsage,
                                 pair.first->second.first->name.location());
                }
            }
        }
    }

    // For each parameter assignment we have, match it up to a real parameter
    if (orderedAssignments) {
        uint32_t orderedIndex = 0;
        for (auto& param : parameterDecls) {
            if (orderedIndex >= orderedParams.size())
                break;

            if (param.isLocalParam)
                continue;

            assignments[param.name] = {orderedParams[orderedIndex++]->expr, isFromConfig};
        }

        // Make sure there aren't extra param assignments for non-existent params.
        if (orderedIndex < orderedParams.size()) {
            auto loc = orderedParams[orderedIndex]->getFirstToken().location();
            auto& diag = scope.addDiag(diag::TooManyParamAssignments, loc);
            diag << definitionName;
            diag << orderedParams.size();
            diag << orderedIndex;
        }
    }
    else {
        // Otherwise handle named assignments.
        for (auto& param : parameterDecls) {
            auto it = namedParams.find(param.name);
            if (it == namedParams.end())
                continue;

            auto arg = it->second.first;
            it->second.second = true;
            if (param.isLocalParam) {
                // Can't assign to localparams, so this is an error.
                DiagCode code = param.isPortParam ? diag::AssignedToLocalPortParam
                                                  : diag::AssignedToLocalBodyParam;

                auto& diag = scope.addDiag(code, arg->name.location());
                diag.addNote(diag::NoteDeclarationHere, param.location);
                continue;
            }

            assignments[param.name] = {arg->expr, isFromConfig};
        }

        for (auto& pair : namedParams) {
            // We marked all the args that we used, so anything left over is a param assignment
            // for a non-existent parameter.
            auto [argSyntax, used] = pair.second;
            if (!used) {
                auto& diag = scope.addDiag(diag::ParameterDoesNotExist, argSyntax->name.location());
                diag << argSyntax->name.valueText();
                diag << definitionName;
            }
        }
    }
}